

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindResult *__return_storage_ptr__,
      BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
      *this,BoyerMooreTextState *state,void *p0,size_t size,utf32_t replacementChar)

{
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *this_00;
  BoyerMooreTextState *state_00;
  size_t i;
  size_t binOffset;
  ulong length;
  size_t textLength;
  Result RVar1;
  DecoderState decoderState;
  BoyerMooreTextFindResult *local_480;
  char *local_478;
  utf32_t local_46c;
  size_t local_468;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *local_460;
  BoyerMooreTextState *local_458;
  SrcUnit *local_450;
  BoyerMooreTextAccessor accessor;
  utf32_t buffer [256];
  DstUnit local_38 [2];
  
  local_450 = (SrcUnit *)(size + (long)p0);
  decoderState = state->m_decoderState;
  local_480 = __return_storage_ptr__;
  local_46c = replacementChar;
  local_460 = &this->
               super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  ;
  local_458 = state;
  while( true ) {
    state_00 = local_458;
    if (local_450 <= p0) {
      *(undefined4 *)&local_480->m_charOffset = 0xffffffff;
      *(undefined4 *)((long)&local_480->m_charOffset + 4) = 0xffffffff;
      *(undefined4 *)&local_480->m_binOffset = 0xffffffff;
      *(undefined4 *)((long)&local_480->m_binOffset + 4) = 0xffffffff;
      local_480->m_binEndOffset = 0xffffffffffffffff;
      return local_480;
    }
    RVar1 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>
            ::convert(&decoderState,buffer,local_38,(SrcUnit *)p0,local_450,local_46c);
    this_00 = local_460;
    local_478 = RVar1.m_src;
    textLength = (long)RVar1.m_dst - (long)buffer >> 2;
    length = (state_00->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length + textLength;
    accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>.
    m_state = state_00;
    accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>.
    m_p = buffer;
    i = BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
        ::findImpl<axl::sl::BoyerMooreTextAccessor>(local_460,&accessor,0,length);
    if (i + (this_00->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count <=
        length) break;
    local_468 = (long)local_478 - (long)p0;
    binOffset = locateBinOffset(state_00,i,(char *)p0,local_478);
    BoyerMooreTextState::advance<false>
              (state_00,i,buffer,textLength,binOffset,p0,local_468,decoderState);
    p0 = local_478;
  }
  createFindResult(local_480,
                   (BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                    *)this_00,state_00,i,(char *)p0,local_478);
  return local_480;
}

Assistant:

BoyerMooreTextFindResult
	find(
		BoyerMooreTextState* state,
		const void* p0,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		ASSERT(state->getPatternLength() == this->m_pattern.getCount());

		sl::PtrIterator<const char, IsReverse> p(IsReverse ? (char*)p0 + size - 1 : (char*)p0);
		const char* end = p + size;

		enc::DecoderState decoderState = state->getDecoderState();

		while (p < end) {
			utf32_t buffer[Details::DecoderBufferLength];

			typename Convert::Result convertResult = Convert::convert(
				&decoderState,
				buffer,
				buffer + countof(buffer),
				p,
				end,
				replacementChar
			);

			const char* p2 = convertResult.m_src; // just a short alias
			size_t srcLength = -(p - p2); // respect IsReverse
			size_t dstLength = convertResult.m_dst - buffer;
			size_t fullLength = state->getTailLength() + dstLength;
			size_t i;

			BoyerMooreTextAccessor accessor(state, buffer);

			if (IsWholeWord) {
				i = findWholeWordImpl(state, accessor, fullLength);
				if (i + this->m_pattern.getCount() < fullLength) // account for suffix
					return createFindResult(state, i, p, p2);

			} else {
				i = this->findImpl(accessor, 0, fullLength);
				if (i + this->m_pattern.getCount() <= fullLength)
					return createFindResult(state, i, p, p2);
			}

			// locate bin-offset of the prospective start of match
			size_t binOffset = locateBinOffset(state, i, p, p2);

			state->advance<IsReverse>(
				i,
				buffer,
				dstLength,
				binOffset,
				IsReverse ? p2 + 1 : (const char*)p,
				srcLength,
				decoderState
			);

 			ASSERT(state->getBinTailSize() >= state->getTailLength());
			p = p2;
		}

		return BoyerMooreTextFindResult();
	}